

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O3

void __thiscall helics::InterfaceInfo::setChangeUpdateFlag(InterfaceInfo *this,bool updateFlag)

{
  pointer puVar1;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *input;
  pointer puVar2;
  unique_lock<std::shared_mutex> local_20;
  
  if (this->only_update_on_change != updateFlag) {
    this->only_update_on_change = updateFlag;
    local_20._M_device = &(this->inputs).m_mutex;
    local_20._M_owns = false;
    std::unique_lock<std::shared_mutex>::lock(&local_20);
    local_20._M_owns = true;
    puVar1 = (this->inputs).m_obj.dataStorage.
             super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar2 = (this->inputs).m_obj.dataStorage.
                  super__Vector_base<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1)
    {
      ((puVar2->_M_t).
       super___uniq_ptr_impl<helics::InputInfo,_std::default_delete<helics::InputInfo>_>._M_t.
       super__Tuple_impl<0UL,_helics::InputInfo_*,_std::default_delete<helics::InputInfo>_>.
       super__Head_base<0UL,_helics::InputInfo_*,_false>._M_head_impl)->only_update_on_change =
           updateFlag;
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_20);
  }
  return;
}

Assistant:

void InterfaceInfo::setChangeUpdateFlag(bool updateFlag)
{
    if (updateFlag != only_update_on_change) {
        only_update_on_change = updateFlag;
        // input is a reference to a unique_ptr
        for (auto& input : inputs.lock()) {  // NOLINT(readability-qualified-auto)
            input->only_update_on_change = updateFlag;
        }
    }
}